

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsRemoveComments(Wlc_Prs_t *p)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  char *pEnd;
  char *pNext;
  char *pCur;
  int fSpecifyFound;
  Wlc_Prs_t *p_local;
  
  bVar1 = false;
  pcVar4 = p->pBuffer + p->nFileSize;
  pNext = p->pBuffer;
LAB_0040b245:
  if (pcVar4 <= pNext) {
    return 1;
  }
  if ((*pNext == '/') && (pNext[1] == '/')) {
    if ((((pNext + 5 < pcVar4) && (pNext[2] == 'a')) && (pNext[3] == 'b')) &&
       ((pNext[4] == 'c' && (pNext[5] == '2')))) {
      builtin_strncpy(pNext,"      ",6);
    }
    else {
      iVar3 = strncmp(pNext + 3,"Pair:",5);
      if (iVar3 == 0) {
        if (p->vPoPairs == (Vec_Str_t *)0x0) {
          pVVar5 = Vec_StrAlloc(100);
          p->vPoPairs = pVVar5;
        }
        for (pEnd = pNext + 9; *pEnd != '\n'; pEnd = pEnd + 1) {
          if (*pEnd == ' ') {
            Vec_StrPush(p->vPoPairs,'\0');
          }
          else if (*pEnd != '\r') {
            Vec_StrPush(p->vPoPairs,*pEnd);
          }
        }
        cVar2 = Vec_StrEntryLast(p->vPoPairs);
        if (cVar2 != '\0') {
          Vec_StrPush(p->vPoPairs,'\0');
        }
      }
      else {
        pcVar6 = Wlc_PrsFindSymbol(pNext,'\n');
        if (pcVar6 == (char *)0x0) {
          iVar3 = Wlc_PrsWriteErrorMessage(p,pNext,"Cannot find end-of-line after symbols \"//\".");
          return iVar3;
        }
        for (; pNext < pcVar6; pNext = pNext + 1) {
          *pNext = ' ';
        }
      }
    }
  }
  else if (*pNext == '`') {
    pcVar6 = Wlc_PrsFindSymbol(pNext,'\n');
    if (pcVar6 == (char *)0x0) {
      iVar3 = Wlc_PrsWriteErrorMessage(p,pNext,"Cannot find end-of-line after symbols \"`\".");
      return iVar3;
    }
    for (; pNext < pcVar6; pNext = pNext + 1) {
      *pNext = ' ';
    }
  }
  else if ((*pNext == '/') && (pNext[1] == '*')) {
    pcVar6 = Wlc_PrsFindSymbolTwo(pNext,'*','/');
    if (pcVar6 == (char *)0x0) {
      iVar3 = Wlc_PrsWriteErrorMessage(p,pNext,"Cannot find symbols \"*/\" after symbols \"/*\".");
      return iVar3;
    }
    for (; pNext < pcVar6 + 2; pNext = pNext + 1) {
      *pNext = ' ';
    }
  }
  else if ((*pNext == 's') &&
          (((pNext[1] == 'p' && (pNext[2] == 'e')) &&
           (iVar3 = strncmp(pNext,"specify",7), iVar3 == 0)))) {
    for (pEnd = pNext; pEnd < pcVar4 + -10; pEnd = pEnd + 1) {
      if (((*pEnd == 'e') && (pEnd[1] == 'n')) &&
         ((pEnd[2] == 'd' && (iVar3 = strncmp(pEnd,"endspecify",10), iVar3 == 0))))
      goto LAB_0040b5b4;
    }
  }
  else if ((((*pNext == 'e') && (pNext[1] == 'n')) && (pNext[2] == 'd')) &&
          (iVar3 = strncmp(pNext,"endmodule",9), iVar3 == 0)) {
    pNext[9] = ';';
  }
  goto LAB_0040b65e;
LAB_0040b5b4:
  for (; pNext < pEnd + 10; pNext = pNext + 1) {
    *pNext = ' ';
  }
  if (!bVar1) {
    Abc_Print(0,"Ignoring specify/endspecify directives.\n");
  }
  bVar1 = true;
LAB_0040b65e:
  if (((*pNext == '\n') || (*pNext == '\r')) || (*pNext == '\t')) {
    *pNext = ' ';
  }
  pNext = pNext + 1;
  goto LAB_0040b245;
}

Assistant:

int Wlc_PrsRemoveComments( Wlc_Prs_t * p )
{
    int fSpecifyFound = 0;
    char * pCur, * pNext, * pEnd = p->pBuffer + p->nFileSize;
    for ( pCur = p->pBuffer; pCur < pEnd; pCur++ )
    {
        // regular comment (//)
        if ( *pCur == '/' && pCur[1] == '/' )
        {
            if ( pCur + 5 < pEnd && pCur[2] == 'a' && pCur[3] == 'b' && pCur[4] == 'c' && pCur[5] == '2' )
                pCur[0] = pCur[1] = pCur[2] = pCur[3] = pCur[4] = pCur[5] = ' ';
            else if ( !strncmp(pCur + 3, "Pair:", 5) )
            {
                if ( p->vPoPairs == NULL )
                    p->vPoPairs = Vec_StrAlloc( 100 );
                for ( pNext = pCur + 9; *pNext != '\n'; pNext++ )
                {
                    if ( *pNext == ' ' )
                        Vec_StrPush( p->vPoPairs, '\0' );
                    else if ( *pNext != '\r' )
                        Vec_StrPush( p->vPoPairs, *pNext );
                }
                if ( Vec_StrEntryLast(p->vPoPairs) != 0 )
                    Vec_StrPush(p->vPoPairs, 0);
            }
            else
            {
                pNext = Wlc_PrsFindSymbol( pCur, '\n' );
                if ( pNext == NULL )
                    return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"//\"." );
                for ( ; pCur < pNext; pCur++ )
                    *pCur = ' ';
            }
        }
        // skip preprocessor directive (`timescale, `celldefine, etc)
        else if ( *pCur == '`' )
        {
            pNext = Wlc_PrsFindSymbol( pCur, '\n' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"`\"." );
            for ( ; pCur < pNext; pCur++ )
                *pCur = ' ';
        }
        // regular comment (/* ... */)
        else if ( *pCur == '/' && pCur[1] == '*' )
        {
            pNext = Wlc_PrsFindSymbolTwo( pCur, '*', '/' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find symbols \"*/\" after symbols \"/*\"." );
            // overwrite comment
            for ( ; pCur < pNext + 2; pCur++ )
                *pCur = ' ';
        }
        // 'specify' treated as comments
        else if ( *pCur == 's' && pCur[1] == 'p' && pCur[2] == 'e' && !strncmp(pCur, "specify", 7) )
        {
            for ( pNext = pCur; pNext < pEnd - 10; pNext++ )
                if ( *pNext == 'e' && pNext[1] == 'n' && pNext[2] == 'd' && !strncmp(pNext, "endspecify", 10) )
                {
                    // overwrite comment
                    for ( ; pCur < pNext + 10; pCur++ )
                        *pCur = ' ';
                    if ( fSpecifyFound == 0 )
                        Abc_Print( 0, "Ignoring specify/endspecify directives.\n" );
                    fSpecifyFound = 1;
                    break;
                }
        }
        // insert semicolons
        else if ( *pCur == 'e' && pCur[1] == 'n' && pCur[2] == 'd' && !strncmp(pCur, "endmodule", 9) )
            pCur[strlen("endmodule")] = ';';
        // overwrite end-of-lines with spaces (less checking to do later on)
        if ( *pCur == '\n' || *pCur == '\r'  || *pCur == '\t' )
            *pCur = ' ';
    }
    return 1;
}